

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void mpt_drange(double *range,int len,double *val,int ld)

{
  double dVar1;
  double *pdStack_20;
  int ld_local;
  double *val_local;
  int len_local;
  double *range_local;
  
  if (len == 0) {
    range[1] = 0.0;
    *range = 0.0;
  }
  else {
    dVar1 = *val;
    range[1] = dVar1;
    *range = dVar1;
    pdStack_20 = val;
    val_local._4_4_ = len;
    if (ld != 0) {
      while (val_local._4_4_ = val_local._4_4_ + -1, 0 < val_local._4_4_) {
        pdStack_20 = pdStack_20 + ld;
        if (*pdStack_20 < *range) {
          *range = *pdStack_20;
        }
        if (range[1] <= *pdStack_20 && *pdStack_20 != range[1]) {
          range[1] = *pdStack_20;
        }
      }
    }
  }
  return;
}

Assistant:

extern void MPT_RANGE_FCN(MPT_RANGE_T range[2], int len, const MPT_RANGE_T *val, int ld)
{
	if (!len) {
#ifdef __cplusplus
		range[0] = range[1] = MPT_RANGE_T();
#else
		range[0] = range[1] = 0;
#endif
		return;
	}
	range[0] = range[1] = *val;
	
	if (!ld) {
		return;
	}
	while (--len > 0) {
		val += ld;
		if (*val < range[0]) {
			range[0] = *val;
		}
		if (*val > range[1]) {
			range[1] = *val;
		}
	}
}